

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

QString * __thiscall QUrlQuery::query(QUrlQuery *this,ComponentFormattingOptions encoding)

{
  bool bVar1;
  char16_t cVar2;
  QUrlQueryPrivate *pQVar3;
  const_iterator o;
  pair<QString,_QString> *ppVar4;
  QString *in_RDI;
  long in_FS_OFFSET;
  int size;
  QString *result;
  const_iterator end;
  const_iterator it;
  ushort tableActions [4];
  undefined4 in_stack_ffffffffffffff18;
  ComponentFormattingOption in_stack_ffffffffffffff1c;
  QList<std::pair<QString,_QString>_> *in_stack_ffffffffffffff20;
  pair<QString,_QString> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff48;
  QFlagsStorage<QUrl::ComponentFormattingOption> in_stack_ffffffffffffff4c;
  const_iterator local_20;
  QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4> local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QSharedDataPointer<QUrlQueryPrivate>::operator!
                    ((QSharedDataPointer<QUrlQueryPrivate> *)0x3141a2);
  if (bVar1) {
    QString::QString((QString *)0x3141b2);
  }
  else {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = QSharedDataPointer<QUrlQueryPrivate>::operator->
                       ((QSharedDataPointer<QUrlQueryPrivate> *)0x3141d0);
    cVar2 = QChar::unicode(&pQVar3->pairDelimiter);
    local_10 = (undefined1 *)(CONCAT62(local_10._2_6_,cVar2) | 0x200);
    pQVar3 = QSharedDataPointer<QUrlQueryPrivate>::operator->
                       ((QSharedDataPointer<QUrlQueryPrivate> *)0x3141f6);
    cVar2 = QChar::unicode(&pQVar3->valueDelimiter);
    local_10._0_4_ = CONCAT22(cVar2,(undefined2)local_10) | 0x2000000;
    local_10 = (undefined1 *)(ulong)(uint)local_10;
    local_18.super_QFlagsStorage<QUrl::ComponentFormattingOption>.i =
         (QFlagsStorage<QUrl::ComponentFormattingOption>)
         QFlags<QUrl::ComponentFormattingOption>::operator&
                   ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_ffffffffffffff20,
                    in_stack_ffffffffffffff1c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_18);
    if (bVar1) {
      local_10._0_6_ = CONCAT24(0x223,(uint)local_10);
    }
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x31428e);
    local_20.i = (pair<QString,_QString> *)&DAT_aaaaaaaaaaaaaaaa;
    QSharedDataPointer<QUrlQueryPrivate>::operator->
              ((QSharedDataPointer<QUrlQueryPrivate> *)0x3142a7);
    local_20 = QList<std::pair<QString,_QString>_>::constBegin(in_stack_ffffffffffffff20);
    QSharedDataPointer<QUrlQueryPrivate>::operator->
              ((QSharedDataPointer<QUrlQueryPrivate> *)0x3142d4);
    o = QList<std::pair<QString,_QString>_>::constEnd(in_stack_ffffffffffffff20);
    while (bVar1 = QList<std::pair<QString,_QString>_>::const_iterator::operator!=(&local_20,o),
          bVar1) {
      ppVar4 = QList<std::pair<QString,_QString>_>::const_iterator::operator->(&local_20);
      QString::size(&ppVar4->first);
      ppVar4 = QList<std::pair<QString,_QString>_>::const_iterator::operator->(&local_20);
      QString::size(&ppVar4->second);
      QList<std::pair<QString,_QString>_>::const_iterator::operator++(&local_20);
    }
    QString::reserve((QString *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                     CONCAT44(in_stack_ffffffffffffff4c.i,in_stack_ffffffffffffff48));
    QSharedDataPointer<QUrlQueryPrivate>::operator->
              ((QSharedDataPointer<QUrlQueryPrivate> *)0x3143f7);
    local_20 = QList<std::pair<QString,_QString>_>::constBegin(in_stack_ffffffffffffff20);
    while( true ) {
      bVar1 = QList<std::pair<QString,_QString>_>::const_iterator::operator!=(&local_20,o);
      in_stack_ffffffffffffff4c.i = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c.i);
      if (!bVar1) break;
      bVar1 = QString::isEmpty((QString *)0x31445d);
      if (!bVar1) {
        QSharedDataPointer<QUrlQueryPrivate>::operator->
                  ((QSharedDataPointer<QUrlQueryPrivate> *)0x31446b);
        QString::operator+=((QString *)in_stack_ffffffffffffff20,
                            (QChar)(char16_t)((ulong)in_stack_ffffffffffffff28 >> 0x30));
      }
      QList<std::pair<QString,_QString>_>::const_iterator::operator->(&local_20);
      recodeAndAppend(&in_stack_ffffffffffffff28->first,(QString *)in_stack_ffffffffffffff20,
                      (ComponentFormattingOptions)in_stack_ffffffffffffff4c.i,
                      (ushort *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QList<std::pair<QString,_QString>_>::const_iterator::operator->(&local_20);
      bVar1 = QString::isNull((QString *)0x3144f1);
      if (!bVar1) {
        QSharedDataPointer<QUrlQueryPrivate>::operator->
                  ((QSharedDataPointer<QUrlQueryPrivate> *)0x31450b);
        QString::operator+=((QString *)in_stack_ffffffffffffff20,
                            (QChar)(char16_t)((ulong)in_stack_ffffffffffffff28 >> 0x30));
        in_stack_ffffffffffffff28 =
             QList<std::pair<QString,_QString>_>::const_iterator::operator->(&local_20);
        recodeAndAppend(&in_stack_ffffffffffffff28->first,(QString *)in_stack_ffffffffffffff20,
                        (ComponentFormattingOptions)in_stack_ffffffffffffff4c.i,
                        (ushort *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
      QList<std::pair<QString,_QString>_>::const_iterator::operator++(&local_20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QUrlQuery::query(QUrl::ComponentFormattingOptions encoding) const
{
    if (!d)
        return QString();

    // unlike the component encoding, for the whole query we need to modify a little:
    //  - the "#" character is unambiguous, so we encode it in EncodeDelimiters mode
    //  - the query delimiter pair must always be encoded

    // start with what's always encoded
    ushort tableActions[] = {
        encode(d->pairDelimiter.unicode()),  // 0
        encode(d->valueDelimiter.unicode()), // 1
        0,                                   // 2
        0
    };
    if (encoding & QUrl::EncodeDelimiters) {
        tableActions[2] = encode('#');
    }

    QString result;
    Map::const_iterator it = d->itemList.constBegin();
    Map::const_iterator end = d->itemList.constEnd();

    {
        int size = 0;
        for ( ; it != end; ++it)
            size += it->first.size() + 1 + it->second.size() + 1;
        result.reserve(size + size / 4);
    }

    for (it = d->itemList.constBegin(); it != end; ++it) {
        if (!result.isEmpty())
            result += QChar(d->pairDelimiter);
        recodeAndAppend(result, it->first, encoding, tableActions);
        if (!it->second.isNull()) {
            result += QChar(d->valueDelimiter);
            recodeAndAppend(result, it->second, encoding, tableActions);
        }
    }
    return result;
}